

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tribench.c
# Opt level: O2

void paint(ATimeUs timestamp,float dt)

{
  undefined4 *puVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint i;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  AVec3f AVar18;
  AMat4f model4;
  AMat4f vp4;
  float local_198;
  float fStack_194;
  undefined8 local_188;
  float afStack_180 [8];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  float local_148;
  float local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  AVec4f local_128;
  AVec4f local_118;
  AVec4f local_108;
  AVec4f local_f8;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined8 local_a0;
  undefined8 uStack_98;
  AGLClearParams local_90;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  fVar8 = (float)timestamp * 1e-06;
  fVar6 = sinf(fVar8 * 0.1);
  fVar7 = sinf(fVar8 * 0.2);
  local_90.r = fVar6 * 0.0;
  local_90.g = fVar7 * 0.0;
  local_90.b = sinf(fVar8 * 0.3);
  local_90.b = local_90.b * 0.0;
  local_90.a = 1.0;
  local_90.depth = 1.0;
  local_90.bits = AGLCB_ColorAndDepth;
  aGLClear(&local_90,&g.target);
  g.pun[2].value.pf = (GLfloat *)&local_e0;
  local_e0 = 0x3f800000;
  local_d8 = 0;
  fVar6 = sinf(fVar8 * 0.37);
  AVar18.x = fVar6 * 0.7;
  AVar18.y = 0.2;
  AVar18.z = 0.7;
  uVar9 = 0;
  uVar10 = 0;
  uVar11 = 0;
  AVar18 = aVec3fNormalize(AVar18);
  local_138 = AVar18.z;
  fVar6 = fVar8 * -0.4 * 0.5;
  uStack_134 = uVar9;
  uStack_130 = uVar10;
  uStack_12c = uVar11;
  local_148 = cosf(fVar6);
  fVar6 = sinf(fVar6);
  fVar7 = local_138 * fVar6;
  local_198 = AVar18.x;
  fStack_194 = AVar18.y;
  local_198 = fVar6 * local_198;
  fVar6 = fVar6 * fStack_194;
  fVar12 = fVar6 * fVar6 + fVar7 * fVar7;
  fVar15 = local_198 * fVar6 + local_148 * fVar7;
  fVar16 = local_198 * fVar7 - fVar6 * local_148;
  fVar13 = local_198 * fVar6 - local_148 * fVar7;
  fVar14 = fVar7 * fVar7 + local_198 * local_198;
  fVar8 = fVar6 * fVar7 + local_148 * local_198;
  fVar17 = fVar7 * local_198 + fVar6 * local_148;
  fVar7 = fVar7 * fVar6 + local_198 * -local_148;
  fVar6 = local_198 * local_198 + fVar6 * fVar6;
  local_d0._4_4_ = fVar15 + fVar15;
  local_d0._0_4_ = 1.0 - (fVar12 + fVar12);
  local_d0._8_4_ = fVar16 + fVar16;
  local_d0._12_4_ = 0;
  local_c0._4_4_ = 1.0 - (fVar14 + fVar14);
  local_c0._0_4_ = fVar13 + fVar13;
  local_c0._8_4_ = fVar8 + fVar8;
  local_c0._12_4_ = 0;
  local_b0._4_4_ = fVar7 + fVar7;
  local_b0._0_4_ = fVar17 + fVar17;
  local_b0._8_4_ = 1.0 - (fVar6 + fVar6);
  local_b0._12_4_ = 0;
  local_a0 = 0;
  uStack_98 = 0x3f80000000000000;
  afStack_180[4] = 0.0;
  afStack_180[5] = 0.0;
  afStack_180[6] = 0.0;
  afStack_180[7] = 0.0;
  local_188 = SUB168(ZEXT416(0x3f800000),0);
  afStack_180[0] = 0.0;
  afStack_180[1] = 0.0;
  afStack_180[2] = 0.0;
  afStack_180[3] = 1.0;
  local_160 = SUB168(ZEXT416(0x3f800000),0);
  uStack_158 = 0;
  local_150 = 0x3f800000c1200000;
  local_128 = g.projection.X;
  local_118 = g.projection.Y;
  local_108 = g.projection.Z;
  local_f8 = g.projection.W;
  puVar1 = &aMat4fMul_m;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    fVar6 = (&local_128.x)[lVar2];
    fVar7 = (&local_118.x)[lVar2];
    fVar8 = (&local_108.x)[lVar2];
    fVar12 = (&local_f8.x)[lVar2];
    for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
      *(float *)((long)puVar1 + lVar3) =
           *(float *)((long)afStack_180 + lVar3 + 4) * fVar12 +
           *(float *)((long)afStack_180 + lVar3) * fVar8 +
           *(float *)((long)&local_188 + lVar3) * fVar6 +
           *(float *)((long)&local_188 + lVar3 + 4) * fVar7;
    }
    puVar1 = puVar1 + 1;
  }
  g.pun[0].value.pf = (GLfloat *)&local_78;
  local_48 = _DAT_0010ac78;
  uStack_40 = uRam000000000010ac80;
  local_58 = _DAT_0010ac68;
  uStack_50 = uRam000000000010ac70;
  local_68 = _DAT_0010ac58;
  uStack_60 = uRam000000000010ac60;
  local_78 = _aMat4fMul_m;
  uStack_70 = uRam000000000010ac50;
  g.pun[1].value.pf = (GLfloat *)local_d0;
  iVar4 = 0;
  for (uVar5 = 0; uVar5 < g.vertices_count / 0x6000; uVar5 = uVar5 + 1) {
    g.draw.primitive.count = 0x6000;
    g.draw.primitive.first = iVar4;
    aGLDraw(&g.draw,&g.merge,&g.target);
    iVar4 = iVar4 + 0x6000;
  }
  g.pun[1].value.pf = (GLfloat *)0x0;
  g.pun[0].value.pf = (GLfloat *)0x0;
  return;
}

Assistant:

static void paint(ATimeUs timestamp, float dt) {
	float t = timestamp * 1e-6f;
	AGLClearParams clear;
	(void)(dt);

	clear.a = 1;
	clear.r = .0f * sinf(t * .1f);
	clear.g = .0f * sinf(t * .2f);
	clear.b = .0f * sinf(t * .3f);
	clear.depth = 1;
	clear.bits = AGLCB_Everything;

	aGLClear(&clear, &g.target);

	struct AVec3f lpos = aVec3f(1, 0, 0);
	g.pun[VUniLightDir].value.pf = &lpos.x;

	struct AReFrame frame;
	frame.orient = aQuatRotation(aVec3fNormalize(aVec3f(.7f * sinf(t * .37f), .2f, .7f)), -t * .4f);
	// frame.orient = aQuatRotation(aVec3fNormalize(aVec3f(1, 1, .6)), t*.1f);
	frame.transl = aVec3f(0, 0, 0);

	struct AMat4f model4 = aMat4fReFrame(frame), vp4 = aMat4fMul(g.projection, aMat4fTranslation(aVec3f(0, 0, -10)));
	g.pun[VUniModel].value.pf = &model4.X.x;
	g.pun[VUniVP].value.pf = &vp4.X.x;

	const unsigned int split = 8192 * 3;
	for (unsigned int i = 0; i < g.vertices_count / split; ++i) {
		g.draw.primitive.first = split * i;
		g.draw.primitive.count = split;
		aGLDraw(&g.draw, &g.merge, &g.target);
	}

	g.pun[VUniModel].value.pf = NULL;
	g.pun[VUniVP].value.pf = NULL;
}